

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

void __thiscall gui::DialogBox::setTitle(DialogBox *this,shared_ptr<gui::Label> *title)

{
  bool bVar1;
  shared_ptr<gui::Widget> *in_RSI;
  ContainerBase *in_RDI;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  Widget *in_stack_ffffffffffffff90;
  Drawable in_stack_ffffffffffffffc0;
  
  std::shared_ptr<gui::Widget>::shared_ptr<gui::Label,void>
            ((shared_ptr<gui::Widget> *)in_stack_ffffffffffffff90,
             (shared_ptr<gui::Label> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
            );
  bVar1 = ContainerBase::hasChild(in_RDI,in_RSI);
  std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x1945a5);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff90 = (Widget *)&stack0xffffffffffffffc0;
    std::shared_ptr<gui::Widget>::shared_ptr<gui::Label,void>
              ((shared_ptr<gui::Widget> *)in_stack_ffffffffffffff90,
               (shared_ptr<gui::Label> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    (*in_RDI->_vptr_ContainerBase[2])(in_RDI,in_stack_ffffffffffffff90);
    std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x1945e2);
  }
  std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x194622);
  Widget::setFocusable(in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  std::shared_ptr<gui::Label>::operator=
            ((shared_ptr<gui::Label> *)in_stack_ffffffffffffff90,
             (shared_ptr<gui::Label> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
            );
  updateTitle((DialogBox *)in_stack_ffffffffffffffc0._vptr_Drawable);
  return;
}

Assistant:

void DialogBox::setTitle(std::shared_ptr<Label> title) {
    if (!hasChild(title)) {
        addChild(title);
    }
    title->setFocusable(false);
    title_ = title;
    updateTitle();
}